

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O2

void put_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  J_COLOR_SPACE JVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  JSAMPARRAY *pppJVar9;
  long lVar10;
  JSAMPROW __src;
  ulong uVar11;
  JDIMENSION JVar12;
  JSAMPARRAY __dest;
  bool bVar13;
  double dVar14;
  
  if (*(int *)&dinfo[1].output_file == 0) {
    pppJVar9 = &dinfo[1].buffer;
  }
  else {
    pppJVar9 = (JSAMPARRAY *)
               (*cinfo->mem->access_virt_sarray)
                         ((j_common_ptr)cinfo,(jvirt_sarray_ptr)dinfo[1].put_pixel_rows,
                          *(JDIMENSION *)((long)&dinfo[1].calc_buffer_dimensions + 4),1,1);
    piVar1 = (int *)((long)&dinfo[1].calc_buffer_dimensions + 4);
    *piVar1 = *piVar1 + 1;
  }
  __dest = *pppJVar9;
  __src = *dinfo->buffer;
  JVar4 = cinfo->out_color_space;
  uVar11 = (ulong)JVar4;
  if (uVar11 == 4) {
    JVar12 = cinfo->output_width;
    for (lVar10 = 0; JVar12 != (JDIMENSION)lVar10; lVar10 = lVar10 + 1) {
      bVar2 = __src[lVar10 * 4 + 1];
      dVar14 = (double)__src[lVar10 * 4 + 3];
      bVar3 = __src[lVar10 * 4 + 2];
      *(JSAMPLE *)((long)__dest + 2) =
           (JSAMPLE)(int)(((double)__src[lVar10 * 4] * dVar14) / 255.0 + 0.5);
      *(JSAMPLE *)((long)__dest + 1) = (JSAMPLE)(int)(((double)bVar2 * dVar14) / 255.0 + 0.5);
      *(JSAMPLE *)__dest = (JSAMPLE)(int)(((double)bVar3 * dVar14) / 255.0 + 0.5);
      __dest = (JSAMPARRAY)((long)__dest + 3);
    }
  }
  else if (JVar4 == JCS_RGB565) {
    JVar12 = cinfo->output_width;
    for (lVar10 = 0; JVar12 != (JDIMENSION)lVar10; lVar10 = lVar10 + 1) {
      *(JSAMPLE *)__dest = __src[lVar10 * 2] << 3;
      *(byte *)((long)__dest + 1) = (byte)(*(ushort *)(__src + lVar10 * 2) >> 3) & 0xfc;
      *(byte *)((long)__dest + 2) = __src[lVar10 * 2 + 1] & 0xf8;
      __dest = (JSAMPARRAY)((long)__dest + 3);
    }
  }
  else if (JVar4 == JCS_EXT_BGR) {
    memcpy(__dest,__src,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4));
    __dest = (JSAMPARRAY)((long)__dest + (ulong)(cinfo->output_width * 3));
  }
  else {
    iVar8 = rgb_red[uVar11];
    iVar5 = rgb_green[uVar11];
    iVar6 = rgb_blue[uVar11];
    iVar7 = rgb_pixelsize[uVar11];
    JVar12 = cinfo->output_width;
    while (bVar13 = JVar12 != 0, JVar12 = JVar12 - 1, bVar13) {
      *(JSAMPLE *)__dest = __src[iVar6];
      *(JSAMPLE *)((long)__dest + 1) = __src[iVar5];
      *(JSAMPLE *)((long)__dest + 2) = __src[iVar8];
      __dest = (JSAMPARRAY)((long)__dest + 3);
      __src = __src + iVar7;
    }
  }
  for (iVar8 = *(int *)&dinfo[1].calc_buffer_dimensions; 0 < iVar8; iVar8 = iVar8 + -1) {
    *(JSAMPLE *)__dest = '\0';
    __dest = (JSAMPARRAY)((long)__dest + 1);
  }
  if (*(int *)&dinfo[1].output_file != 0) {
    return;
  }
  fwrite(dinfo[1].buffer,1,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4),
         (FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
               JDIMENSION rows_supplied)
/* This version is for writing 24-bit pixels */
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;
  JSAMPARRAY image_ptr;
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;
  int pad;

  if (dest->use_inversion_array) {
    /* Access next row in virtual array */
    image_ptr = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, dest->whole_image,
       dest->cur_output_row, (JDIMENSION)1, TRUE);
    dest->cur_output_row++;
    outptr = image_ptr[0];
  } else {
    outptr = dest->iobuffer;
  }

  /* Transfer data.  Note destination values must be in BGR order
   * (even though Microsoft's own documents say the opposite).
   */
  inptr = dest->pub.buffer[0];

  if (cinfo->out_color_space == JCS_EXT_BGR) {
    MEMCOPY(outptr, inptr, dest->row_width);
    outptr += cinfo->output_width * 3;
  } else if (cinfo->out_color_space == JCS_RGB565) {
    boolean big_endian = is_big_endian();
    unsigned short *inptr2 = (unsigned short *)inptr;
    for (col = cinfo->output_width; col > 0; col--) {
      if (big_endian) {
        outptr[0] = (*inptr2 >> 5) & 0xF8;
        outptr[1] = ((*inptr2 << 5) & 0xE0) | ((*inptr2 >> 11) & 0x1C);
        outptr[2] = *inptr2 & 0xF8;
      } else {
        outptr[0] = (*inptr2 << 3) & 0xF8;
        outptr[1] = (*inptr2 >> 3) & 0xFC;
        outptr[2] = (*inptr2 >> 8) & 0xF8;
      }
      outptr += 3;
      inptr2++;
    }
  } else if (cinfo->out_color_space == JCS_CMYK) {
    for (col = cinfo->output_width; col > 0; col--) {
      JSAMPLE c = *inptr++, m = *inptr++, y = *inptr++, k = *inptr++;
      cmyk_to_rgb(c, m, y, k, outptr + 2, outptr + 1, outptr);
      outptr += 3;
    }
  } else {
    register int rindex = rgb_red[cinfo->out_color_space];
    register int gindex = rgb_green[cinfo->out_color_space];
    register int bindex = rgb_blue[cinfo->out_color_space];
    register int ps = rgb_pixelsize[cinfo->out_color_space];

    for (col = cinfo->output_width; col > 0; col--) {
      outptr[0] = inptr[bindex];
      outptr[1] = inptr[gindex];
      outptr[2] = inptr[rindex];
      outptr += 3;  inptr += ps;
    }
  }

  /* Zero out the pad bytes. */
  pad = dest->pad_bytes;
  while (--pad >= 0)
    *outptr++ = 0;

  if (!dest->use_inversion_array)
    (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->row_width);
}